

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

bool __thiscall CDirectiveData::Validate(CDirectiveData *this,ValidateState *state)

{
  FileManager *this_00;
  int64_t iVar1;
  size_t sVar2;
  size_t sVar3;
  
  iVar1 = FileManager::getVirtualAddress(g_fileManager);
  this->position = iVar1;
  sVar2 = getDataSize(this);
  switch(this->mode) {
  case U8:
  case U16:
  case U32:
  case U64:
  case Ascii:
    encodeNormal(this);
    break;
  case Float:
  case Double:
    encodeFloat(this);
    break;
  case Sjis:
    encodeSjis(this);
    break;
  case Custom:
    encodeCustom(this,&Global.Table);
    break;
  default:
    Logger::queueError<>(Error,"Invalid encoding type");
  }
  this_00 = g_fileManager;
  sVar3 = getDataSize(this);
  FileManager::advanceMemory(this_00,sVar3);
  sVar3 = getDataSize(this);
  return sVar2 != sVar3;
}

Assistant:

bool CDirectiveData::Validate(const ValidateState &state)
{
	position = g_fileManager->getVirtualAddress();

	size_t oldSize = getDataSize();
	switch (mode)
	{
	case EncodingMode::U8:
	case EncodingMode::U16:
	case EncodingMode::U32:
	case EncodingMode::U64:
	case EncodingMode::Ascii:
		encodeNormal();
		break;
	case EncodingMode::Float:
	case EncodingMode::Double:
		encodeFloat();
		break;
	case EncodingMode::Sjis:
		encodeSjis();
		break;
	case EncodingMode::Custom:
		encodeCustom(Global.Table);
		break;
	default:
		Logger::queueError(Logger::Error, "Invalid encoding type");
		break;
	}

	g_fileManager->advanceMemory(getDataSize());
	return oldSize != getDataSize();
}